

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O2

void skiwi::anon_unknown_23::load_test(void)

{
  ulong uVar1;
  char *pcVar2;
  string *psVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  allocator<char> local_a9;
  string script;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  skiwi_parameters params;
  
  skiwi::skiwi_parameters::skiwi_parameters(&params);
  skiwi::scheme_with_skiwi(0,0);
  pcVar2 = "(load \"./data/load_test_1.scm\")";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&script,"(load \"./data/load_test_1.scm\")",&local_a9);
  skiwi::skiwi_run((skiwi *)&script,(string *)pcVar2);
  std::__cxx11::string::~string((string *)&script);
  psVar3 = (string *)0x1c6df8;
  std::__cxx11::string::string<std::allocator<char>>((string *)&script,"result",&local_a9);
  uVar1 = skiwi::skiwi_run_raw((skiwi *)&script,psVar3);
  std::__cxx11::string::~string((string *)&script);
  skiwi::skiwi_raw_to_string_abi_cxx11_((skiwi *)&local_68,uVar1,6);
  TestEq<char_const*,std::__cxx11::string>
            ("9",&local_68,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x14ba,"void skiwi::(anonymous namespace)::load_test()");
  std::__cxx11::string::~string((string *)&local_68);
  pcVar2 = "\n(load (string-append \"./data/\" \"load_test_2.scm\"))\n(add3 5)\n";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&script,
             "\n(load (string-append \"./data/\" \"load_test_2.scm\"))\n(add3 5)\n",&local_a9);
  uVar1 = skiwi::skiwi_run_raw((skiwi *)&script,(string *)pcVar2);
  skiwi::skiwi_raw_to_string_abi_cxx11_((skiwi *)&local_88,uVar1,6);
  TestEq<char_const*,std::__cxx11::string>
            ("8",&local_88,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x14c8,"void skiwi::(anonymous namespace)::load_test()");
  this = &local_88;
  std::__cxx11::string::~string((string *)this);
  skiwi::skiwi_quit((skiwi *)this);
  std::__cxx11::string::~string((string *)&script);
  return;
}

Assistant:

void load_test()
    {
    using namespace skiwi;
    skiwi_parameters params;
    params.trace = nullptr;
    params.stderror = &std::cout;
    params.stdoutput = nullptr;
    scheme_with_skiwi(nullptr, nullptr, params);
#ifdef _WIN32
    skiwi_run("(load \"data\\\\load_test_1.scm\")");
#else
    skiwi_run("(load \"./data/load_test_1.scm\")");
#endif
    uint64_t res = skiwi_run_raw("result");
    TEST_EQ("9", skiwi_raw_to_string(res));

#ifdef _WIN32
    std::string script = R"(
(load (string-append "data\\" "load_test_2.scm"))
(add3 5)
)";
#else
    std::string script = R"(
(load (string-append "./data/" "load_test_2.scm"))
(add3 5)
)";
#endif
    res = skiwi_run_raw(script);
    TEST_EQ("8", skiwi_raw_to_string(res));
    skiwi_quit();
    }